

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Gatherv(void *sendbuf,int sendcount,MPIABI_Datatype sendtype,void *recvbuf,
                  int *recvcounts,int *displs,MPIABI_Datatype recvtype,int root,MPIABI_Comm comm)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  ompi_datatype_t *poVar5;
  ompi_datatype_t *poVar6;
  ompi_communicator_t *poVar7;
  WPI_Handle<ompi_communicator_t_*> local_50;
  WPI_Handle<ompi_datatype_t_*> local_48;
  WPI_Handle<ompi_datatype_t_*> local_40;
  int *local_38;
  int *displs_local;
  int *recvcounts_local;
  void *recvbuf_local;
  MPIABI_Datatype sendtype_local;
  void *pvStack_10;
  int sendcount_local;
  void *sendbuf_local;
  
  local_38 = displs;
  displs_local = recvcounts;
  recvcounts_local = (int *)recvbuf;
  recvbuf_local = (void *)sendtype;
  sendtype_local._4_4_ = sendcount;
  pvStack_10 = sendbuf;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle(&local_40,sendtype);
  poVar5 = WPI_Handle::operator_cast_to_ompi_datatype_t_((WPI_Handle *)&local_40);
  piVar3 = recvcounts_local;
  piVar2 = displs_local;
  piVar1 = local_38;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle(&local_48,recvtype);
  poVar6 = WPI_Handle::operator_cast_to_ompi_datatype_t_((WPI_Handle *)&local_48);
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle(&local_50,comm);
  poVar7 = WPI_Handle::operator_cast_to_ompi_communicator_t_((WPI_Handle *)&local_50);
  iVar4 = MPI_Gatherv(sendbuf,sendcount,poVar5,piVar3,piVar2,piVar1,poVar6,root,poVar7);
  return iVar4;
}

Assistant:

int MPIABI_Gatherv(
  const void * sendbuf,
  int sendcount,
  MPIABI_Datatype sendtype,
  void * recvbuf,
  const int * recvcounts,
  const int * displs,
  MPIABI_Datatype recvtype,
  int root,
  MPIABI_Comm comm
) {
  return MPI_Gatherv(
    sendbuf,
    sendcount,
    (MPI_Datatype)(WPI_Datatype)sendtype,
    recvbuf,
    recvcounts,
    displs,
    (MPI_Datatype)(WPI_Datatype)recvtype,
    root,
    (MPI_Comm)(WPI_Comm)comm
  );
}